

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load(CImg<unsigned_char> *this,char *filename)

{
  char cVar1;
  uint value;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  uint *puVar8;
  CImgArgumentException *this_00;
  CImg<unsigned_char> *pCVar9;
  CImgIOException *this_01;
  char cVar10;
  char cVar11;
  char *__s;
  CImg<char> filename_local;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar5 = "non-";
    if (this->_is_shared != false) {
      pcVar5 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar5,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  lVar4 = 0;
  do {
    cVar1 = filename[lVar4];
    cVar10 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar10 = cVar1;
    }
    cVar1 = "http://"[lVar4];
    cVar11 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar11 = cVar1;
    }
    if (cVar10 != cVar11) {
      if ((int)lVar4 != 7) {
        lVar4 = 0;
        goto LAB_0011adc5;
      }
      break;
    }
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 7);
  goto LAB_0011ae05;
LAB_0011ae77:
  do {
    __s = pcVar5;
    pcVar6 = strchr(__s,0x2e);
    pcVar5 = pcVar6 + 1;
  } while (filename <= pcVar6 + 1);
  if (__s == filename) {
    sVar7 = strlen(filename);
    __s = filename + sVar7;
  }
  puVar8 = cimg::_exception_mode(0,false);
  value = *puVar8;
  cimg::_exception_mode(0,true);
  if (__s != (char *)0x0) {
    sVar7 = strlen(__s);
    iVar2 = (int)sVar7;
    iVar3 = 3;
    if (iVar2 < 3) {
      iVar3 = iVar2;
    }
    if ((iVar3 != -1) && (-1 < iVar2)) {
      iVar3 = 3;
      if (iVar2 < 3) {
        iVar3 = iVar2;
      }
      lVar4 = 0;
      do {
        cVar1 = __s[lVar4];
        cVar10 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar10 = cVar1;
        }
        cVar1 = "asc"[lVar4];
        cVar11 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar11 = cVar1;
        }
        if (cVar10 != cVar11) {
          iVar3 = 3;
          if (iVar2 < 3) {
            iVar3 = iVar2;
          }
          if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar4)) {
            sVar7 = strlen(__s);
            iVar2 = (int)sVar7;
            iVar3 = 3;
            if (iVar2 < 3) {
              iVar3 = iVar2;
            }
            if ((iVar3 == -1) || (iVar2 < 0)) goto LAB_0011b139;
            iVar3 = 3;
            if (iVar2 < 3) {
              iVar3 = iVar2;
            }
            lVar4 = 0;
            goto LAB_0011afa2;
          }
          break;
        }
        lVar4 = lVar4 + 1;
      } while (iVar3 + 1 != (int)lVar4);
    }
    _load_ascii(this,(FILE *)0x0,filename);
    goto LAB_0011b946;
  }
LAB_0011b3d0:
  iVar3 = cimg::strcasecmp(__s,"jfif");
  if ((iVar3 != 0) && (iVar3 = cimg::strcasecmp(__s,"jif"), iVar3 != 0)) {
    iVar3 = cimg::strcasecmp(__s,"png");
    if (iVar3 == 0) {
      _load_png(this,(FILE *)0x0,filename);
    }
    else {
      iVar3 = cimg::strcasecmp(__s,"ppm");
      if ((((iVar3 == 0) || (iVar3 = cimg::strcasecmp(__s,"pgm"), iVar3 == 0)) ||
          (iVar3 = cimg::strcasecmp(__s,"pnm"), iVar3 == 0)) ||
         ((iVar3 = cimg::strcasecmp(__s,"pbm"), iVar3 == 0 ||
          (iVar3 = cimg::strcasecmp(__s,"pnk"), iVar3 == 0)))) {
        _load_pnm(this,(FILE *)0x0,filename);
      }
      else {
        iVar3 = cimg::strcasecmp(__s,"pfm");
        if (iVar3 == 0) {
          _load_pfm(this,(FILE *)0x0,filename);
        }
        else {
          iVar3 = cimg::strcasecmp(__s,"tif");
          if ((iVar3 == 0) || (iVar3 = cimg::strcasecmp(__s,"tiff"), iVar3 == 0)) {
            load_tiff(this,filename,0,0xffffffff,1,(float *)0x0,(CImg<char> *)0x0);
          }
          else {
            iVar3 = cimg::strcasecmp(__s,"exr");
            if (iVar3 == 0) {
              load_exr(this,filename);
            }
            else {
              iVar3 = cimg::strcasecmp(__s,"cr2");
              if (((((iVar3 == 0) || (iVar3 = cimg::strcasecmp(__s,"crw"), iVar3 == 0)) ||
                   (iVar3 = cimg::strcasecmp(__s,"dcr"), iVar3 == 0)) ||
                  (((iVar3 = cimg::strcasecmp(__s,"mrw"), iVar3 == 0 ||
                    (iVar3 = cimg::strcasecmp(__s,"nef"), iVar3 == 0)) ||
                   ((iVar3 = cimg::strcasecmp(__s,"orf"), iVar3 == 0 ||
                    ((iVar3 = cimg::strcasecmp(__s,"pix"), iVar3 == 0 ||
                     (iVar3 = cimg::strcasecmp(__s,"ptx"), iVar3 == 0)))))))) ||
                 ((iVar3 = cimg::strcasecmp(__s,"raf"), iVar3 == 0 ||
                  (iVar3 = cimg::strcasecmp(__s,"srf"), iVar3 == 0)))) {
                load_dcraw_external(this,filename);
              }
              else {
                iVar3 = cimg::strcasecmp(__s,"gif");
                if (iVar3 == 0) {
                  load_gif_external(this,filename,'z',0.0);
                }
                else {
                  iVar3 = cimg::strcasecmp(__s,"dcm");
                  if ((iVar3 == 0) || (iVar3 = cimg::strcasecmp(__s,"dicom"), iVar3 == 0)) {
                    load_medcon_external(this,filename);
                  }
                  else {
                    iVar3 = cimg::strcasecmp(__s,"hdr");
                    if ((iVar3 == 0) || (iVar3 = cimg::strcasecmp(__s,"nii"), iVar3 == 0)) {
                      _load_analyze(this,(FILE *)0x0,filename,(float *)0x0);
                    }
                    else {
                      iVar3 = cimg::strcasecmp(__s,"par");
                      if ((iVar3 == 0) || (iVar3 = cimg::strcasecmp(__s,"rec"), iVar3 == 0)) {
                        load_parrec(this,filename,'c',0.0);
                      }
                      else {
                        iVar3 = cimg::strcasecmp(__s,"mnc");
                        if (iVar3 == 0) {
                          load_minc2(this,filename);
                        }
                        else {
                          iVar3 = cimg::strcasecmp(__s,"inr");
                          if (iVar3 == 0) {
                            _load_inr(this,(FILE *)0x0,filename,(float *)0x0);
                          }
                          else {
                            iVar3 = cimg::strcasecmp(__s,"pan");
                            if (iVar3 == 0) {
                              _load_pandore(this,(FILE *)0x0,filename);
                            }
                            else {
                              iVar3 = cimg::strcasecmp(__s,"cimg");
                              if (((iVar3 == 0) ||
                                  (iVar3 = cimg::strcasecmp(__s,"cimgz"), iVar3 == 0)) ||
                                 (*__s == '\0')) {
                                pCVar9 = load_cimg(this,filename,'z',0.0);
                                return pCVar9;
                              }
                              iVar3 = cimg::strcasecmp(__s,"gz");
                              if (iVar3 == 0) {
                                load_gzip_external(this,filename);
                              }
                              else {
                                iVar3 = cimg::strcasecmp(__s,"avi");
                                if (((((((iVar3 != 0) &&
                                        (iVar3 = cimg::strcasecmp(__s,"mov"), iVar3 != 0)) &&
                                       ((iVar3 = cimg::strcasecmp(__s,"asf"), iVar3 != 0 &&
                                        ((iVar3 = cimg::strcasecmp(__s,"divx"), iVar3 != 0 &&
                                         (iVar3 = cimg::strcasecmp(__s,"flv"), iVar3 != 0)))))) &&
                                      (iVar3 = cimg::strcasecmp(__s,"mpg"), iVar3 != 0)) &&
                                     ((((((iVar3 = cimg::strcasecmp(__s,"m1v"), iVar3 != 0 &&
                                          (iVar3 = cimg::strcasecmp(__s,"m2v"), iVar3 != 0)) &&
                                         (iVar3 = cimg::strcasecmp(__s,"m4v"), iVar3 != 0)) &&
                                        ((iVar3 = cimg::strcasecmp(__s,"mjp"), iVar3 != 0 &&
                                         (iVar3 = cimg::strcasecmp(__s,"mp4"), iVar3 != 0)))) &&
                                       (iVar3 = cimg::strcasecmp(__s,"mkv"), iVar3 != 0)) &&
                                      ((iVar3 = cimg::strcasecmp(__s,"mpe"), iVar3 != 0 &&
                                       (iVar3 = cimg::strcasecmp(__s,"movie"), iVar3 != 0)))))) &&
                                    (((iVar3 = cimg::strcasecmp(__s,"ogm"), iVar3 != 0 &&
                                      (((iVar3 = cimg::strcasecmp(__s,"ogg"), iVar3 != 0 &&
                                        (iVar3 = cimg::strcasecmp(__s,"ogv"), iVar3 != 0)) &&
                                       (iVar3 = cimg::strcasecmp(__s,"qt"), iVar3 != 0)))) &&
                                     (((iVar3 = cimg::strcasecmp(__s,"rm"), iVar3 != 0 &&
                                       (iVar3 = cimg::strcasecmp(__s,"vob"), iVar3 != 0)) &&
                                      (iVar3 = cimg::strcasecmp(__s,"wmv"), iVar3 != 0)))))) &&
                                   ((iVar3 = cimg::strcasecmp(__s,"xvid"), iVar3 != 0 &&
                                    (iVar3 = cimg::strcasecmp(__s,"mpeg"), iVar3 != 0)))) {
                                  this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
                                  CImgIOException::CImgIOException
                                            (this_01,"CImg<%s>::load()","unsigned char");
                                  __cxa_throw(this_01,&CImgIOException::typeinfo,
                                              CImgException::~CImgException);
                                }
                                load_video(this,filename,0,0xffffffff,1,'z',0.0);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_0011b946;
  }
  goto LAB_0011b91b;
  while (lVar4 = lVar4 + 1, iVar3 + 1 != (int)lVar4) {
LAB_0011afa2:
    cVar1 = __s[lVar4];
    cVar10 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar10 = cVar1;
    }
    cVar1 = "dlm"[lVar4];
    cVar11 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar11 = cVar1;
    }
    if (cVar10 != cVar11) {
      iVar3 = 3;
      if (iVar2 < 3) {
        iVar3 = iVar2;
      }
      if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar4)) {
        sVar7 = strlen(__s);
        iVar2 = (int)sVar7;
        iVar3 = 3;
        if (iVar2 < 3) {
          iVar3 = iVar2;
        }
        if ((iVar3 != -1) && (-1 < iVar2)) {
          iVar3 = 3;
          if (iVar2 < 3) {
            iVar3 = iVar2;
          }
          lVar4 = 0;
          goto LAB_0011b055;
        }
      }
      break;
    }
  }
  goto LAB_0011b139;
  while (lVar4 = lVar4 + 1, iVar3 + 1 != (int)lVar4) {
LAB_0011b055:
    cVar1 = __s[lVar4];
    cVar10 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar10 = cVar1;
    }
    cVar1 = "txt"[lVar4];
    cVar11 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar11 = cVar1;
    }
    if (cVar10 != cVar11) {
      iVar3 = 3;
      if (iVar2 < 3) {
        iVar3 = iVar2;
      }
      if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar4)) {
        sVar7 = strlen(__s);
        iVar2 = (int)sVar7;
        iVar3 = 3;
        if (iVar2 < 3) {
          iVar3 = iVar2;
        }
        if ((iVar3 == -1) || (iVar2 < 0)) goto LAB_0011b1f0;
        iVar3 = 3;
        if (iVar2 < 3) {
          iVar3 = iVar2;
        }
        lVar4 = 0;
        goto LAB_0011b0f6;
      }
      break;
    }
  }
LAB_0011b139:
  _load_dlm(this,(FILE *)0x0,filename);
  goto LAB_0011b946;
  while (lVar4 = lVar4 + 1, iVar3 + 1 != (int)lVar4) {
LAB_0011b0f6:
    cVar1 = __s[lVar4];
    cVar10 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar10 = cVar1;
    }
    cVar1 = "bmp"[lVar4];
    cVar11 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar11 = cVar1;
    }
    if (cVar10 != cVar11) {
      iVar3 = 3;
      if (iVar2 < 3) {
        iVar3 = iVar2;
      }
      if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar4)) {
        sVar7 = strlen(__s);
        iVar2 = (int)sVar7;
        iVar3 = 3;
        if (iVar2 < 3) {
          iVar3 = iVar2;
        }
        if ((iVar3 == -1) || (iVar2 < 0)) goto LAB_0011b91b;
        iVar3 = 3;
        if (iVar2 < 3) {
          iVar3 = iVar2;
        }
        lVar4 = 0;
        goto LAB_0011b1a9;
      }
      break;
    }
  }
LAB_0011b1f0:
  _load_bmp(this,(FILE *)0x0,filename);
  goto LAB_0011b946;
  while (lVar4 = lVar4 + 1, iVar3 + 1 != (int)lVar4) {
LAB_0011b1a9:
    cVar1 = __s[lVar4];
    cVar10 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar10 = cVar1;
    }
    cVar1 = "jpg"[lVar4];
    cVar11 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar11 = cVar1;
    }
    if (cVar10 != cVar11) {
      iVar3 = 3;
      if (iVar2 < 3) {
        iVar3 = iVar2;
      }
      if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar4)) {
        sVar7 = strlen(__s);
        iVar2 = (int)sVar7;
        iVar3 = 4;
        if (iVar2 < 4) {
          iVar3 = iVar2;
        }
        if ((iVar3 != -1) && (-1 < iVar2)) {
          iVar3 = 4;
          if (iVar2 < 4) {
            iVar3 = iVar2;
          }
          lVar4 = 0;
          goto LAB_0011b2cd;
        }
      }
      break;
    }
  }
  goto LAB_0011b91b;
  while (lVar4 = lVar4 + 1, iVar3 + 1 != (int)lVar4) {
LAB_0011b2cd:
    cVar1 = __s[lVar4];
    cVar10 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar10 = cVar1;
    }
    cVar1 = "jpeg"[lVar4];
    cVar11 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar11 = cVar1;
    }
    if (cVar10 != cVar11) {
      iVar3 = 4;
      if (iVar2 < 4) {
        iVar3 = iVar2;
      }
      if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar4)) {
        sVar7 = strlen(__s);
        iVar2 = (int)sVar7;
        iVar3 = 3;
        if (iVar2 < 3) {
          iVar3 = iVar2;
        }
        if ((iVar3 != -1) && (-1 < iVar2)) {
          iVar3 = 3;
          if (iVar2 < 3) {
            iVar3 = iVar2;
          }
          lVar4 = 0;
          goto LAB_0011b36e;
        }
      }
      break;
    }
  }
  goto LAB_0011b91b;
  while (lVar4 = lVar4 + 1, (int)lVar4 != 8) {
LAB_0011adc5:
    cVar1 = filename[lVar4];
    cVar10 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar10 = cVar1;
    }
    cVar1 = "https://"[lVar4];
    cVar11 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar11 = cVar1;
    }
    if (cVar10 != cVar11) {
      pcVar5 = filename;
      if ((int)lVar4 != 8) goto LAB_0011ae77;
      break;
    }
  }
LAB_0011ae05:
  CImg<char>::CImg(&filename_local,0x100,1,1,1);
  pcVar5 = cimg::load_network(filename,filename_local._data,0,false);
  load(this,pcVar5);
  remove(filename_local._data);
  if (filename_local._is_shared != false) {
    return this;
  }
  if (filename_local._data == (char *)0x0) {
    return this;
  }
  operator_delete__(filename_local._data);
  return this;
  while (lVar4 = lVar4 + 1, iVar3 + 1 != (int)lVar4) {
LAB_0011b36e:
    cVar1 = __s[lVar4];
    cVar10 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar10 = cVar1;
    }
    cVar1 = "jpe"[lVar4];
    cVar11 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar11 = cVar1;
    }
    if (cVar10 != cVar11) {
      iVar3 = 3;
      if (iVar2 < 3) {
        iVar3 = iVar2;
      }
      if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar4)) goto LAB_0011b3d0;
      break;
    }
  }
LAB_0011b91b:
  _load_jpeg(this,(FILE *)0x0,filename);
LAB_0011b946:
  cimg::_exception_mode(value,true);
  return this;
}

Assistant:

CImg<T>& load(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load(): Specified filename is (null).",
                                    cimg_instance);

      if (!cimg::strncasecmp(filename,"http://",7) || !cimg::strncasecmp(filename,"https://",8)) {
        CImg<charT> filename_local(256);
        load(cimg::load_network(filename,filename_local));
        std::remove(filename_local);
        return *this;
      }

      const char *const ext = cimg::split_filename(filename);
      const unsigned int omode = cimg::exception_mode();
      cimg::exception_mode(0);
      try {
#ifdef cimg_load_plugin
        cimg_load_plugin(filename);
#endif
#ifdef cimg_load_plugin1
        cimg_load_plugin1(filename);
#endif
#ifdef cimg_load_plugin2
        cimg_load_plugin2(filename);
#endif
#ifdef cimg_load_plugin3
        cimg_load_plugin3(filename);
#endif
#ifdef cimg_load_plugin4
        cimg_load_plugin4(filename);
#endif
#ifdef cimg_load_plugin5
        cimg_load_plugin5(filename);
#endif
#ifdef cimg_load_plugin6
        cimg_load_plugin6(filename);
#endif
#ifdef cimg_load_plugin7
        cimg_load_plugin7(filename);
#endif
#ifdef cimg_load_plugin8
        cimg_load_plugin8(filename);
#endif
        // Ascii formats
        if (!cimg::strcasecmp(ext,"asc")) load_ascii(filename);
        else if (!cimg::strcasecmp(ext,"dlm") ||
                 !cimg::strcasecmp(ext,"txt")) load_dlm(filename);

        // 2d binary formats
        else if (!cimg::strcasecmp(ext,"bmp")) load_bmp(filename);
        else if (!cimg::strcasecmp(ext,"jpg") ||
                 !cimg::strcasecmp(ext,"jpeg") ||
                 !cimg::strcasecmp(ext,"jpe") ||
                 !cimg::strcasecmp(ext,"jfif") ||
                 !cimg::strcasecmp(ext,"jif")) load_jpeg(filename);
        else if (!cimg::strcasecmp(ext,"png")) load_png(filename);
        else if (!cimg::strcasecmp(ext,"ppm") ||
                 !cimg::strcasecmp(ext,"pgm") ||
                 !cimg::strcasecmp(ext,"pnm") ||
                 !cimg::strcasecmp(ext,"pbm") ||
                 !cimg::strcasecmp(ext,"pnk")) load_pnm(filename);
        else if (!cimg::strcasecmp(ext,"pfm")) load_pfm(filename);
        else if (!cimg::strcasecmp(ext,"tif") ||
                 !cimg::strcasecmp(ext,"tiff")) load_tiff(filename);
        else if (!cimg::strcasecmp(ext,"exr")) load_exr(filename);
        else if (!cimg::strcasecmp(ext,"cr2") ||
                 !cimg::strcasecmp(ext,"crw") ||
                 !cimg::strcasecmp(ext,"dcr") ||
                 !cimg::strcasecmp(ext,"mrw") ||
                 !cimg::strcasecmp(ext,"nef") ||
                 !cimg::strcasecmp(ext,"orf") ||
                 !cimg::strcasecmp(ext,"pix") ||
                 !cimg::strcasecmp(ext,"ptx") ||
                 !cimg::strcasecmp(ext,"raf") ||
                 !cimg::strcasecmp(ext,"srf")) load_dcraw_external(filename);
        else if (!cimg::strcasecmp(ext,"gif")) load_gif_external(filename);

        // 3d binary formats
        else if (!cimg::strcasecmp(ext,"dcm") ||
                 !cimg::strcasecmp(ext,"dicom")) load_medcon_external(filename);
        else if (!cimg::strcasecmp(ext,"hdr") ||
                 !cimg::strcasecmp(ext,"nii")) load_analyze(filename);
        else if (!cimg::strcasecmp(ext,"par") ||
                 !cimg::strcasecmp(ext,"rec")) load_parrec(filename);
        else if (!cimg::strcasecmp(ext,"mnc")) load_minc2(filename);
        else if (!cimg::strcasecmp(ext,"inr")) load_inr(filename);
        else if (!cimg::strcasecmp(ext,"pan")) load_pandore(filename);
        else if (!cimg::strcasecmp(ext,"cimg") ||
                 !cimg::strcasecmp(ext,"cimgz") ||
                 !*ext)  return load_cimg(filename);

        // Archive files
        else if (!cimg::strcasecmp(ext,"gz")) load_gzip_external(filename);

        // Image sequences
        else if (!cimg::strcasecmp(ext,"avi") ||
                 !cimg::strcasecmp(ext,"mov") ||
                 !cimg::strcasecmp(ext,"asf") ||
                 !cimg::strcasecmp(ext,"divx") ||
                 !cimg::strcasecmp(ext,"flv") ||
                 !cimg::strcasecmp(ext,"mpg") ||
                 !cimg::strcasecmp(ext,"m1v") ||
                 !cimg::strcasecmp(ext,"m2v") ||
                 !cimg::strcasecmp(ext,"m4v") ||
                 !cimg::strcasecmp(ext,"mjp") ||
                 !cimg::strcasecmp(ext,"mp4") ||
                 !cimg::strcasecmp(ext,"mkv") ||
                 !cimg::strcasecmp(ext,"mpe") ||
                 !cimg::strcasecmp(ext,"movie") ||
                 !cimg::strcasecmp(ext,"ogm") ||
                 !cimg::strcasecmp(ext,"ogg") ||
                 !cimg::strcasecmp(ext,"ogv") ||
                 !cimg::strcasecmp(ext,"qt") ||
                 !cimg::strcasecmp(ext,"rm") ||
                 !cimg::strcasecmp(ext,"vob") ||
                 !cimg::strcasecmp(ext,"wmv") ||
                 !cimg::strcasecmp(ext,"xvid") ||
                 !cimg::strcasecmp(ext,"mpeg")) load_video(filename);
        else throw CImgIOException("CImg<%s>::load()",
                                   pixel_type());
      } catch (CImgIOException&) {
        std::FILE *file = 0;
        try {
          file = cimg::fopen(filename,"rb");
        } catch (CImgIOException&) {
          cimg::exception_mode(omode);
          throw CImgIOException(_cimg_instance
                                "load(): Failed to open file '%s'.",
                                cimg_instance,
                                filename);
        }

        try {
          const char *const f_type = cimg::ftype(file,filename);
          std::fclose(file);
          if (!cimg::strcasecmp(f_type,"pnm")) load_pnm(filename);
          else if (!cimg::strcasecmp(f_type,"pfm")) load_pfm(filename);
          else if (!cimg::strcasecmp(f_type,"bmp")) load_bmp(filename);
          else if (!cimg::strcasecmp(f_type,"inr")) load_inr(filename);
          else if (!cimg::strcasecmp(f_type,"jpg")) load_jpeg(filename);
          else if (!cimg::strcasecmp(f_type,"pan")) load_pandore(filename);
          else if (!cimg::strcasecmp(f_type,"png")) load_png(filename);
          else if (!cimg::strcasecmp(f_type,"tif")) load_tiff(filename);
          else if (!cimg::strcasecmp(f_type,"gif")) load_gif_external(filename);
          else if (!cimg::strcasecmp(f_type,"dcm")) load_medcon_external(filename);
          else throw CImgIOException("CImg<%s>::load()",
                                     pixel_type());
        } catch (CImgIOException&) {
          try {
            load_other(filename);
          } catch (CImgIOException&) {
            cimg::exception_mode(omode);
            throw CImgIOException(_cimg_instance
                                  "load(): Failed to recognize format of file '%s'.",
                                  cimg_instance,
                                  filename);
          }
        }
      }
      cimg::exception_mode(omode);
      return *this;
    }